

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  long lVar2;
  Thread *pTVar3;
  undefined8 *puVar4;
  int result;
  Thread threads [3];
  
  puVar4 = &DAT_00153c80;
  pTVar3 = threads;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    pTVar3->window = (GLFWwindow *)*puVar4;
    puVar4 = puVar4 + 1;
    pTVar3 = (Thread *)&pTVar3->title;
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    glfwWindowHint(0x20004,0);
    iVar1 = 200;
    for (lVar2 = 8; lVar2 != 0x80; lVar2 = lVar2 + 0x28) {
      handle = glfwCreateWindow(200,200,*(char **)((long)&threads[0].window + lVar2),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      *(GLFWwindow **)(&stack0xffffffffffffff50 + lVar2) = handle;
      if (handle == (GLFWwindow *)0x0) goto LAB_00115d5a;
      glfwSetKeyCallback(handle,key_callback);
      glfwSetWindowPos(handle,iVar1,200);
      glfwShowWindow(handle);
      iVar1 = iVar1 + 0xfa;
    }
    glfwMakeContextCurrent(threads[0].window);
    gladLoadGL(glfwGetProcAddress);
    glfwMakeContextCurrent((GLFWwindow *)0x0);
    lVar2 = 4;
    pTVar3 = threads;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) {
        while (running != 0) {
          glfwWaitEvents();
          for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x28) {
            iVar1 = glfwWindowShouldClose(*(GLFWwindow **)((long)&threads[0].window + lVar2));
            if (iVar1 != 0) {
              running = 0;
            }
          }
        }
        for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x28) {
          glfwHideWindow(*(GLFWwindow **)((long)&threads[0].window + lVar2));
        }
        for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x28) {
          thrd_join(*(thrd_t *)((long)&threads[0].id + lVar2),&result);
        }
        exit(0);
      }
      iVar1 = thrd_create(&pTVar3->id,thread_main,pTVar3);
      pTVar3 = pTVar3 + 1;
    } while (iVar1 == 1);
    fwrite("Failed to create secondary thread\n",0x22,1,_stderr);
LAB_00115d5a:
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i, result;
    Thread threads[] =
    {
        { NULL, "Red", 1.f, 0.f, 0.f, 0 },
        { NULL, "Green", 0.f, 1.f, 0.f, 0 },
        { NULL, "Blue", 0.f, 0.f, 1.f, 0 }
    };
    const int count = sizeof(threads) / sizeof(Thread);

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < count;  i++)
    {
        threads[i].window = glfwCreateWindow(200, 200,
                                             threads[i].title,
                                             NULL, NULL);
        if (!threads[i].window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(threads[i].window, key_callback);

        glfwSetWindowPos(threads[i].window, 200 + 250 * i, 200);
        glfwShowWindow(threads[i].window);
    }

    glfwMakeContextCurrent(threads[0].window);
    gladLoadGL(glfwGetProcAddress);
    glfwMakeContextCurrent(NULL);

    for (i = 0;  i < count;  i++)
    {
        if (thrd_create(&threads[i].id, thread_main, threads + i) !=
            thrd_success)
        {
            fprintf(stderr, "Failed to create secondary thread\n");

            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    while (running)
    {
        glfwWaitEvents();

        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(threads[i].window))
                running = GLFW_FALSE;
        }
    }

    for (i = 0;  i < count;  i++)
        glfwHideWindow(threads[i].window);

    for (i = 0;  i < count;  i++)
        thrd_join(threads[i].id, &result);

    exit(EXIT_SUCCESS);
}